

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O0

void opj_mct_decode_real(OPJ_FLOAT32 *c0,OPJ_FLOAT32 *c1,OPJ_FLOAT32 *c2,OPJ_SIZE_T n)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  OPJ_FLOAT32 b;
  OPJ_FLOAT32 g;
  OPJ_FLOAT32 r;
  OPJ_FLOAT32 v;
  OPJ_FLOAT32 u;
  OPJ_FLOAT32 y;
  __m128 vb;
  __m128 vg;
  __m128 vr;
  __m128 vv;
  __m128 vu;
  __m128 vy;
  __m128 vbu;
  __m128 vgv;
  __m128 vgu;
  __m128 vrv;
  uint local_39c;
  OPJ_UINT32 i;
  OPJ_SIZE_T n_local;
  OPJ_FLOAT32 *c2_local;
  OPJ_FLOAT32 *c1_local;
  OPJ_FLOAT32 *c0_local;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  
  n_local = (OPJ_SIZE_T)c2;
  c2_local = c1;
  c1_local = c0;
  for (local_39c = 0; (ulong)local_39c < n >> 3; local_39c = local_39c + 1) {
    local_158 = (float)*(undefined8 *)n_local;
    fStack_154 = (float)((ulong)*(undefined8 *)n_local >> 0x20);
    fStack_150 = (float)*(undefined8 *)(n_local + 8);
    fStack_14c = (float)((ulong)*(undefined8 *)(n_local + 8) >> 0x20);
    local_258 = (float)*(undefined8 *)c1_local;
    fStack_254 = (float)((ulong)*(undefined8 *)c1_local >> 0x20);
    fStack_250 = (float)*(undefined8 *)(c1_local + 2);
    fStack_24c = (float)((ulong)*(undefined8 *)(c1_local + 2) >> 0x20);
    local_178 = (float)*(undefined8 *)c2_local;
    fStack_174 = (float)((ulong)*(undefined8 *)c2_local >> 0x20);
    fStack_170 = (float)*(undefined8 *)(c2_local + 2);
    fStack_16c = (float)((ulong)*(undefined8 *)(c2_local + 2) >> 0x20);
    *(ulong *)c1_local = CONCAT44(fStack_254 + fStack_154 * 1.402,local_258 + local_158 * 1.402);
    *(ulong *)(c1_local + 2) =
         CONCAT44(fStack_24c + fStack_14c * 1.402,fStack_250 + fStack_150 * 1.402);
    *(ulong *)c2_local =
         CONCAT44((fStack_254 - fStack_174 * 0.34413) - fStack_154 * 0.71414,
                  (local_258 - local_178 * 0.34413) - local_158 * 0.71414);
    *(ulong *)(c2_local + 2) =
         CONCAT44((fStack_24c - fStack_16c * 0.34413) - fStack_14c * 0.71414,
                  (fStack_250 - fStack_170 * 0.34413) - fStack_150 * 0.71414);
    *(ulong *)n_local = CONCAT44(fStack_254 + fStack_174 * 1.772,local_258 + local_178 * 1.772);
    *(ulong *)(n_local + 8) =
         CONCAT44(fStack_24c + fStack_16c * 1.772,fStack_250 + fStack_170 * 1.772);
    uVar4 = *(undefined8 *)(c1_local + 4);
    uVar5 = *(undefined8 *)(c2_local + 4);
    uVar6 = *(undefined8 *)(n_local + 0x10);
    local_1d8 = (float)uVar6;
    fStack_1d4 = (float)((ulong)uVar6 >> 0x20);
    fStack_1d0 = (float)*(undefined8 *)(n_local + 0x18);
    fStack_1cc = (float)((ulong)*(undefined8 *)(n_local + 0x18) >> 0x20);
    local_298 = (float)uVar4;
    fStack_294 = (float)((ulong)uVar4 >> 0x20);
    fStack_290 = (float)*(undefined8 *)(c1_local + 6);
    fStack_28c = (float)((ulong)*(undefined8 *)(c1_local + 6) >> 0x20);
    local_1f8 = (float)uVar5;
    fStack_1f4 = (float)((ulong)uVar5 >> 0x20);
    fStack_1f0 = (float)*(undefined8 *)(c2_local + 6);
    fStack_1ec = (float)((ulong)*(undefined8 *)(c2_local + 6) >> 0x20);
    *(ulong *)(c1_local + 4) =
         CONCAT44(fStack_294 + fStack_1d4 * 1.402,local_298 + local_1d8 * 1.402);
    *(ulong *)(c1_local + 6) =
         CONCAT44(fStack_28c + fStack_1cc * 1.402,fStack_290 + fStack_1d0 * 1.402);
    *(ulong *)(c2_local + 4) =
         CONCAT44((fStack_294 - fStack_1f4 * 0.34413) - fStack_1d4 * 0.71414,
                  (local_298 - local_1f8 * 0.34413) - local_1d8 * 0.71414);
    *(ulong *)(c2_local + 6) =
         CONCAT44((fStack_28c - fStack_1ec * 0.34413) - fStack_1cc * 0.71414,
                  (fStack_290 - fStack_1f0 * 0.34413) - fStack_1d0 * 0.71414);
    *(undefined8 *)(n_local + 0x10) =
         CONCAT44(fStack_294 + fStack_1f4 * 1.772,local_298 + local_1f8 * 1.772);
    *(ulong *)(n_local + 0x18) =
         CONCAT44(fStack_28c + fStack_1ec * 1.772,fStack_290 + fStack_1f0 * 1.772);
    c1_local = c1_local + 8;
    c2_local = c2_local + 8;
    n_local = n_local + 0x20;
  }
  for (local_39c = 0; (ulong)local_39c < (n & 7); local_39c = local_39c + 1) {
    fVar1 = (float)c1_local[local_39c];
    fVar2 = (float)c2_local[local_39c];
    fVar3 = *(float *)(n_local + (ulong)local_39c * 4);
    c1_local[local_39c] = (OPJ_FLOAT32)(fVar3 * 1.402 + fVar1);
    c2_local[local_39c] = (OPJ_FLOAT32)(-fVar3 * 0.71414 + -fVar2 * 0.34413 + fVar1);
    *(float *)(n_local + (ulong)local_39c * 4) = fVar2 * 1.772 + fVar1;
  }
  return;
}

Assistant:

void opj_mct_decode_real(
    OPJ_FLOAT32* OPJ_RESTRICT c0,
    OPJ_FLOAT32* OPJ_RESTRICT c1,
    OPJ_FLOAT32* OPJ_RESTRICT c2,
    OPJ_SIZE_T n)
{
    OPJ_UINT32 i;
#ifdef __SSE__
    __m128 vrv, vgu, vgv, vbu;
    vrv = _mm_set1_ps(1.402f);
    vgu = _mm_set1_ps(0.34413f);
    vgv = _mm_set1_ps(0.71414f);
    vbu = _mm_set1_ps(1.772f);
    for (i = 0; i < (n >> 3); ++i) {
        __m128 vy, vu, vv;
        __m128 vr, vg, vb;

        vy = _mm_load_ps(c0);
        vu = _mm_load_ps(c1);
        vv = _mm_load_ps(c2);
        vr = _mm_add_ps(vy, _mm_mul_ps(vv, vrv));
        vg = _mm_sub_ps(_mm_sub_ps(vy, _mm_mul_ps(vu, vgu)), _mm_mul_ps(vv, vgv));
        vb = _mm_add_ps(vy, _mm_mul_ps(vu, vbu));
        _mm_store_ps(c0, vr);
        _mm_store_ps(c1, vg);
        _mm_store_ps(c2, vb);
        c0 += 4;
        c1 += 4;
        c2 += 4;

        vy = _mm_load_ps(c0);
        vu = _mm_load_ps(c1);
        vv = _mm_load_ps(c2);
        vr = _mm_add_ps(vy, _mm_mul_ps(vv, vrv));
        vg = _mm_sub_ps(_mm_sub_ps(vy, _mm_mul_ps(vu, vgu)), _mm_mul_ps(vv, vgv));
        vb = _mm_add_ps(vy, _mm_mul_ps(vu, vbu));
        _mm_store_ps(c0, vr);
        _mm_store_ps(c1, vg);
        _mm_store_ps(c2, vb);
        c0 += 4;
        c1 += 4;
        c2 += 4;
    }
    n &= 7;
#endif
    for (i = 0; i < n; ++i) {
        OPJ_FLOAT32 y = c0[i];
        OPJ_FLOAT32 u = c1[i];
        OPJ_FLOAT32 v = c2[i];
        OPJ_FLOAT32 r = y + (v * 1.402f);
        OPJ_FLOAT32 g = y - (u * 0.34413f) - (v * (0.71414f));
        OPJ_FLOAT32 b = y + (u * 1.772f);
        c0[i] = r;
        c1[i] = g;
        c2[i] = b;
    }
}